

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IsGroupOf_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::IsGroupOf_PDU::Encode(IsGroupOf_PDU *this,KDataStream *stream)

{
  pointer pKVar1;
  GED *pGVar2;
  ulong uVar3;
  long lVar4;
  
  Header7::Encode(&this->super_Header,stream);
  (*(this->m_GroupedEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_GroupedEntityID,stream);
  KDataStream::Write(stream,this->m_ui8GrpdEntCat);
  KDataStream::Write(stream,this->m_ui8NumOfGroupedEnts);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32Padding1);
  KDataStream::Write<double>(stream,(double)this->m_f64GrpLat);
  KDataStream::Write<double>(stream,(double)this->m_f64GrpLon);
  uVar3 = 0;
  while( true ) {
    uVar3 = uVar3 & 0xff;
    pKVar1 = (this->m_vpGED).
             super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar4 = (long)(this->m_vpGED).
                  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pKVar1;
    if ((ulong)(lVar4 / 0x18) <= uVar3) break;
    pGVar2 = pKVar1[uVar3].m_pRef;
    (*(pGVar2->super_DataTypeBase)._vptr_DataTypeBase[5])(pGVar2,stream,lVar4 % 0x18);
    uVar3 = (ulong)((int)uVar3 + 1);
  }
  return;
}

Assistant:

void IsGroupOf_PDU::Encode( KDataStream & stream ) const
{
    Header::Encode( stream );

    stream << KDIS_STREAM m_GroupedEntityID
           << m_ui8GrpdEntCat
           << m_ui8NumOfGroupedEnts
           << m_ui32Padding1
           << m_f64GrpLat
           << m_f64GrpLon;

    KUINT8 i = 0;

    while( i < m_vpGED.size() )
    {
        m_vpGED[i]->Encode( stream );
        ++i;
    }
}